

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int ark_MRIStepInnerReset(MRIStepInnerStepper stepper,sunrealtype tR,N_Vector yR)

{
  int iVar1;
  int iVar2;
  void *arkode_mem;
  void *local_10;
  
  iVar1 = MRIStepInnerStepper_GetContent(stepper,&local_10);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = ARKodeReset(local_10,tR,yR);
    iVar2 = -(uint)(iVar2 != 0);
  }
  return iVar2;
}

Assistant:

int ark_MRIStepInnerReset(MRIStepInnerStepper stepper, sunrealtype tR, N_Vector yR)
{
  void* arkode_mem;
  int retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) { return -1; }
  retval = ARKodeReset(arkode_mem, tR, yR);
  if (retval == ARK_SUCCESS) { return 0; }
  return -1;
}